

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::UnionUnPackSignature_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumDef *enum_def,bool inclass)

{
  char *__lhs;
  string local_150;
  byte local_129;
  string local_128;
  byte local_102;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  EnumDef *pEStack_20;
  bool inclass_local;
  EnumDef *enum_def_local;
  CppGenerator *this_local;
  
  __lhs = "";
  if (inclass) {
    __lhs = "static ";
  }
  local_21 = inclass;
  pEStack_20 = enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"void *",&local_c9);
  std::operator+(&local_a8,__lhs,&local_c8);
  local_102 = 0;
  local_129 = 0;
  if ((local_21 & 1) == 0) {
    Name_abi_cxx11_(&local_128,this,&pEStack_20->super_Definition);
    local_129 = 1;
    std::operator+(&local_100,&local_128,"Union::");
  }
  else {
    std::allocator<char>::allocator();
    local_102 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  }
  std::operator+(&local_88,&local_a8,&local_100);
  std::operator+(&local_68,&local_88,"UnPack(const void *obj, ");
  Name_abi_cxx11_(&local_150,this,&pEStack_20->super_Definition);
  std::operator+(&local_48,&local_68,&local_150);
  std::operator+(__return_storage_ptr__,&local_48,
                 " type, const ::flatbuffers::resolver_function_t *resolver)");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_100);
  if ((local_129 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_128);
  }
  if ((local_102 & 1) != 0) {
    std::allocator<char>::~allocator(&local_101);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  return __return_storage_ptr__;
}

Assistant:

std::string UnionUnPackSignature(const EnumDef &enum_def, bool inclass) {
    return (inclass ? "static " : "") + std::string("void *") +
           (inclass ? "" : Name(enum_def) + "Union::") +
           "UnPack(const void *obj, " + Name(enum_def) +
           " type, const ::flatbuffers::resolver_function_t *resolver)";
  }